

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

uchar * nvpair_unpack_number(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  int *piVar1;
  uint64_t uVar2;
  uint8_t *p;
  uchar *puVar3;
  
  if (nvp->nvp_type == 3) {
    if ((nvp->nvp_datasize == 8) && (7 < *leftp)) {
      if (isbe) {
        uVar2 = be64dec(ptr);
      }
      else {
        uVar2 = *(uint64_t *)ptr;
      }
      nvp->nvp_data = uVar2;
      puVar3 = ptr + 8;
      *leftp = *leftp - 8;
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      puVar3 = (uchar *)0x0;
    }
    return puVar3;
  }
  __assert_fail("nvp->nvp_type == 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x2e0,
                "const unsigned char *nvpair_unpack_number(_Bool, nvpair_t *, const unsigned char *, size_t *)"
               );
}

Assistant:

const unsigned char *
nvpair_unpack_number(bool isbe, nvpair_t *nvp, const unsigned char *ptr,
     size_t *leftp)
{

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_NUMBER);

	if (nvp->nvp_datasize != sizeof(uint64_t)) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}
	if (*leftp < sizeof(uint64_t)) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	if (isbe)
		nvp->nvp_data = be64dec(ptr);
	else
		nvp->nvp_data = le64dec(ptr);

	ptr += sizeof(uint64_t);
	*leftp -= sizeof(uint64_t);

	return (ptr);
}